

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveWriter.cpp
# Opt level: O3

EStatusCode __thiscall
CFFPrimitiveWriter::WriteCard16(CFFPrimitiveWriter *this,unsigned_short inValue)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_12;
  undefined1 local_11;
  
  if (this->mInternalState != eFailure) {
    iVar1 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_12,1);
    if (CONCAT44(extraout_var,iVar1) == 1) {
      if (this->mInternalState == eFailure) {
        return eFailure;
      }
      iVar1 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_11,1);
      if (CONCAT44(extraout_var_00,iVar1) == 1) {
        return eSuccess;
      }
    }
    this->mInternalState = eFailure;
  }
  return eFailure;
}

Assistant:

EStatusCode CFFPrimitiveWriter::WriteCard16(unsigned short inValue)
{
	Byte byte1 = (inValue>>8) & 0xff;
	Byte byte2 = inValue & 0xff;
    
	if(WriteByte(byte1) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;
    
	if(WriteByte(byte2) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;
    
	return PDFHummus::eSuccess;
}